

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O2

int __thiscall zmq::socket_poller_t::modify_fd(socket_poller_t *this,fd_t fd_,short events_)

{
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  e_;
  int iVar1;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  _Var2;
  int *piVar3;
  _func_bool_item_t_ptr_int *in_RCX;
  fd_t fd__local;
  
  e_._M_current =
       (this->_items).
       super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  fd__local = fd_;
  _Var2 = find_if2<__gnu_cxx::__normal_iterator<zmq::socket_poller_t::item_t*,std::vector<zmq::socket_poller_t::item_t,std::allocator<zmq::socket_poller_t::item_t>>>,int,bool(*)(zmq::socket_poller_t::item_t_const&,int)>
                    ((this->_items).
                     super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,e_,&fd__local,in_RCX);
  if (_Var2._M_current == e_._M_current) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar1 = -1;
  }
  else {
    (_Var2._M_current)->events = events_;
    this->_need_rebuild = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int zmq::socket_poller_t::modify_fd (fd_t fd_, short events_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    it->events = events_;
    _need_rebuild = true;

    return 0;
}